

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

void __thiscall Varnode::copySymbol(Varnode *this,Varnode *vn)

{
  Varnode *vn_local;
  Varnode *this_local;
  
  this->type = vn->type;
  this->mapentry = vn->mapentry;
  this->flags = this->flags & 0xfffffcff;
  this->flags = vn->flags & 0x300 | this->flags;
  if (this->high != (HighVariable *)0x0) {
    HighVariable::typeDirty(this->high);
  }
  return;
}

Assistant:

void Varnode::copySymbol(const Varnode *vn)

{
  type = vn->type;		// Copy any type
  mapentry = vn->mapentry;	// Copy any symbol
  flags &= ~(Varnode::typelock | Varnode::namelock);
  flags |= (Varnode::typelock | Varnode::namelock) & vn->flags;
  if (high != (HighVariable *)0)
    high->typeDirty();
}